

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode cr_in_init(Curl_easy *data,Curl_creader *reader)

{
  void *pvVar1;
  cr_in_ctx *ctx;
  Curl_creader *reader_local;
  Curl_easy *data_local;
  
  pvVar1 = reader->ctx;
  *(curl_read_callback *)((long)pvVar1 + 0x20) = (data->state).fread_func;
  *(void **)((long)pvVar1 + 0x28) = (data->state).in;
  *(undefined8 *)((long)pvVar1 + 0x30) = 0xffffffffffffffff;
  *(undefined8 *)((long)pvVar1 + 0x38) = 0;
  return CURLE_OK;
}

Assistant:

static CURLcode cr_in_init(struct Curl_easy *data, struct Curl_creader *reader)
{
  struct cr_in_ctx *ctx = reader->ctx;
  (void)data;
  ctx->read_cb = data->state.fread_func;
  ctx->cb_user_data = data->state.in;
  ctx->total_len = -1;
  ctx->read_len = 0;
  return CURLE_OK;
}